

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_write_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ecp_curve_info **ppmVar2;
  mbedtls_ecp_curve_info **ppmVar3;
  mbedtls_ecp_curve_info **ppmVar4;
  byte bVar5;
  uchar uVar6;
  mbedtls_key_exchange_type_t mVar7;
  int iVar8;
  mbedtls_md_type_t md_type;
  mbedtls_ecp_group_id *pmVar9;
  size_t sVar10;
  mbedtls_md_info_t *pmVar11;
  mbedtls_ssl_key_cert *pmVar12;
  mbedtls_ssl_handshake_params *pmVar13;
  mbedtls_ssl_config *pmVar14;
  int line;
  mbedtls_ecp_group_id mVar15;
  long lVar16;
  mbedtls_ecp_curve_info *pmVar17;
  mbedtls_pk_context *pmVar18;
  char *text;
  size_t hash_len;
  uchar *output;
  uchar *puVar19;
  size_t signature_len;
  size_t len;
  uchar hash [64];
  mbedtls_md_context_t ctx;
  mbedtls_md5_context mbedtls_md5;
  uchar *local_148;
  undefined8 local_140;
  size_t local_138;
  uchar *local_130;
  uchar local_128 [16];
  uchar local_118 [48];
  mbedtls_sha1_context local_e8;
  mbedtls_md5_context local_88;
  
  puVar19 = ssl->out_msg;
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  local_148 = puVar19 + 4;
  lVar16 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xa7f,"=> write server key exchange");
  mVar7 = pmVar1->key_exchange;
  output = local_148;
  if (mVar7 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
    if ((0xa2U >> (mVar7 & 0x1f) & 1) != 0) {
      iVar8 = 0xa88;
LAB_0011f6b3:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar8,"<= skip write server key exchange");
      ssl->state = ssl->state + 1;
      return 0;
    }
    if ((0x140U >> (mVar7 & 0x1f) & 1) == 0) {
      if ((0x600U >> (mVar7 & 0x1f) & 1) != 0) {
        if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
            (pmVar12 = ssl->handshake->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) &&
           (pmVar12 = ssl->conf->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar18 = (mbedtls_pk_context *)0x0;
        }
        else {
          pmVar18 = pmVar12->key;
        }
        iVar8 = mbedtls_pk_can_do(pmVar18,MBEDTLS_PK_ECKEY);
        if (iVar8 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xa59,"server key not ECDH capable");
        }
        else {
          pmVar13 = ssl->handshake;
          if ((pmVar13 == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar12 = pmVar13->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar12 = ssl->conf->key_cert;
          }
          iVar8 = mbedtls_ecdh_get_params
                            (&pmVar13->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar12->key->pk_ctx,
                             MBEDTLS_ECDH_OURS);
          if (iVar8 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xa61,"mbedtls_ecdh_get_params",iVar8);
          }
        }
        iVar8 = 0xa95;
        goto LAB_0011f6b3;
      }
    }
    else {
      puVar19[4] = '\0';
      puVar19[5] = '\0';
      mVar7 = pmVar1->key_exchange;
      lVar16 = 2;
      output = puVar19 + 6;
    }
  }
  if ((mVar7 | MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
    pmVar14 = ssl->conf;
    if (((pmVar14->dhm_P).p == (mbedtls_mpi_uint *)0x0) ||
       ((pmVar14->dhm_G).p == (mbedtls_mpi_uint *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xac4,"no DH parameters set");
      return -0x7100;
    }
    iVar8 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).P,&pmVar14->dhm_P);
    if ((iVar8 != 0) ||
       (iVar8 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).G,&ssl->conf->dhm_G), iVar8 != 0)) {
      text = "mbedtls_mpi_copy";
      line = 0xad4;
      goto LAB_0011fc56;
    }
    pmVar13 = ssl->handshake;
    sVar10 = mbedtls_mpi_size(&(pmVar13->dhm_ctx).P);
    iVar8 = mbedtls_dhm_make_params
                      (&pmVar13->dhm_ctx,(int)sVar10,output,&local_138,
                       (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    sVar10 = local_138;
    if (iVar8 != 0) {
      text = "mbedtls_dhm_make_params";
      line = 0xadc;
      goto LAB_0011fc56;
    }
    puVar19 = output + local_138;
    lVar16 = lVar16 + local_138;
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae6,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae7,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae8,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae9,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
    mVar7 = pmVar1->key_exchange;
    local_148 = output;
    output = puVar19;
  }
  else {
    sVar10 = 0;
  }
  puVar19 = output;
  if ((mVar7 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x118U >> (mVar7 & 0x1f) & 1) != 0)) {
    pmVar9 = ssl->conf->curve_list;
    mVar15 = *pmVar9;
    if (mVar15 == MBEDTLS_ECP_DP_NONE) {
LAB_0011f6c2:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb07,"no matching curve for ECDHE");
      return -0x7380;
    }
    ppmVar2 = ssl->handshake->curves;
    ppmVar4 = ppmVar2;
    pmVar17 = *ppmVar2;
    do {
      while (ppmVar3 = ppmVar4, pmVar17 != (mbedtls_ecp_curve_info *)0x0) {
        if (pmVar17->grp_id == mVar15) goto LAB_0011f594;
        ppmVar4 = ppmVar3 + 1;
        pmVar17 = ppmVar3[1];
      }
      mVar15 = pmVar9[1];
      pmVar9 = pmVar9 + 1;
      ppmVar4 = ppmVar2;
      pmVar17 = *ppmVar2;
    } while (mVar15 != MBEDTLS_ECP_DP_NONE);
    pmVar17 = *ppmVar3;
    if (pmVar17 == (mbedtls_ecp_curve_info *)0x0) goto LAB_0011f6c2;
LAB_0011f594:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xb0b,"ECDHE curve: %s",pmVar17->name);
    iVar8 = mbedtls_ecp_group_load(&(ssl->handshake->ecdh_ctx).grp,(*ppmVar3)->grp_id);
    if (iVar8 != 0) {
      text = "mbedtls_ecp_group_load";
      line = 0xb10;
      goto LAB_0011fc56;
    }
    iVar8 = mbedtls_ecdh_make_params
                      (&ssl->handshake->ecdh_ctx,&local_138,output,0x4000 - lVar16,
                       (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar8 != 0) {
      text = "mbedtls_ecdh_make_params";
      line = 0xb18;
      goto LAB_0011fc56;
    }
    lVar16 = lVar16 + local_138;
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xb22,"ECDH: Q ",&(ssl->handshake->ecdh_ctx).Q);
    mVar7 = pmVar1->key_exchange;
    puVar19 = output + local_138;
    sVar10 = local_138;
    local_148 = output;
  }
  if (mVar7 - MBEDTLS_KEY_EXCHANGE_DHE_RSA < 3) {
    local_140 = 0;
    local_130 = puVar19;
    if (ssl->minor_ver == 3) {
      md_type = mbedtls_ssl_md_alg_from_hash((uchar)ssl->handshake->sig_alg);
      if (md_type == MBEDTLS_MD_NONE) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb3c,"should never happen");
        return -0x6c00;
      }
LAB_0011f848:
      pmVar11 = mbedtls_md_info_from_type(md_type);
      mbedtls_md_init((mbedtls_md_context_t *)&local_e8);
      iVar8 = mbedtls_md_setup((mbedtls_md_context_t *)&local_e8,pmVar11,0);
      if (iVar8 != 0) {
        text = "mbedtls_md_setup";
        line = 0xb90;
        goto LAB_0011fc56;
      }
      mbedtls_md_starts((mbedtls_md_context_t *)&local_e8);
      mbedtls_md_update((mbedtls_md_context_t *)&local_e8,ssl->handshake->randbytes,0x40);
      mbedtls_md_update((mbedtls_md_context_t *)&local_e8,local_148,sVar10);
      mbedtls_md_finish((mbedtls_md_context_t *)&local_e8,local_128);
      mbedtls_md_free((mbedtls_md_context_t *)&local_e8);
      pmVar11 = mbedtls_md_info_from_type(md_type);
      bVar5 = mbedtls_md_get_size(pmVar11);
      sVar10 = (size_t)bVar5;
      hash_len = 0;
    }
    else {
      md_type = MBEDTLS_MD_SHA1;
      if (mVar7 == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) goto LAB_0011f848;
      mbedtls_md5_init(&local_88);
      mbedtls_sha1_init(&local_e8);
      mbedtls_md5_starts(&local_88);
      mbedtls_md5_update(&local_88,ssl->handshake->randbytes,0x40);
      mbedtls_md5_update(&local_88,local_148,sVar10);
      mbedtls_md5_finish(&local_88,local_128);
      mbedtls_sha1_starts(&local_e8);
      mbedtls_sha1_update(&local_e8,ssl->handshake->randbytes,0x40);
      mbedtls_sha1_update(&local_e8,local_148,sVar10);
      mbedtls_sha1_finish(&local_e8,local_118);
      mbedtls_md5_free(&local_88);
      mbedtls_sha1_free(&local_e8);
      md_type = MBEDTLS_MD_NONE;
      hash_len = 0x24;
      sVar10 = 0x24;
    }
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xba3,"parameters hash",local_128,sVar10);
    puVar19 = local_130;
    pmVar13 = ssl->handshake;
    if ((((pmVar13 == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar12 = pmVar13->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) &&
        (pmVar12 = ssl->conf->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) ||
       (pmVar12->key == (mbedtls_pk_context *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xbaa,"got no private key");
      return -0x7600;
    }
    if (ssl->minor_ver == 3) {
      *local_130 = (uchar)pmVar13->sig_alg;
      if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
          (pmVar12 = ssl->handshake->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) &&
         (pmVar12 = ssl->conf->key_cert, pmVar12 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar18 = (mbedtls_pk_context *)0x0;
      }
      else {
        pmVar18 = pmVar12->key;
      }
      uVar6 = mbedtls_ssl_sig_from_pk(pmVar18);
      puVar19[1] = uVar6;
      puVar19 = puVar19 + 2;
      lVar16 = lVar16 + 2;
      pmVar13 = ssl->handshake;
    }
    if (pmVar13 == (mbedtls_ssl_handshake_params *)0x0) {
      pmVar14 = ssl->conf;
LAB_0011fb64:
      pmVar12 = pmVar14->key_cert;
      if (pmVar12 != (mbedtls_ssl_key_cert *)0x0) goto LAB_0011fb70;
      pmVar18 = (mbedtls_pk_context *)0x0;
    }
    else {
      pmVar12 = pmVar13->key_cert;
      pmVar14 = ssl->conf;
      if (pmVar12 == (mbedtls_ssl_key_cert *)0x0) goto LAB_0011fb64;
LAB_0011fb70:
      pmVar18 = pmVar12->key;
    }
    iVar8 = mbedtls_pk_sign(pmVar18,md_type,local_128,hash_len,puVar19 + 2,&local_140,
                            (_func_int_void_ptr_uchar_ptr_size_t *)pmVar14->f_rng,pmVar14->p_rng);
    if (iVar8 != 0) {
      text = "mbedtls_pk_sign";
      line = 0xbbc;
      goto LAB_0011fc56;
    }
    *puVar19 = local_140._1_1_;
    puVar19[1] = (uchar)local_140;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xbc4,"my signature",puVar19 + 2,local_140);
    lVar16 = lVar16 + local_140 + 2;
  }
  ssl->out_msglen = lVar16 + 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\f';
  ssl->state = ssl->state + 1;
  iVar8 = mbedtls_ssl_write_record(ssl);
  if (iVar8 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xbd8,"<= write server key exchange");
    return 0;
  }
  text = "mbedtls_ssl_write_record";
  line = 0xbd4;
LAB_0011fc56:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,line,text,iVar8);
  return iVar8;
}

Assistant:

static int ssl_write_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t n = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
                            ssl->transform_negotiate->ciphersuite_info;

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    unsigned char *p = ssl->out_msg + 4;
    unsigned char *dig_signed = p;
    size_t dig_signed_len = 0, len;
    ((void) dig_signed);
    ((void) dig_signed_len);
    ((void) len);
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        ssl_get_ecdh_params_from_cert( ssl );

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        size_t jlen;
        const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;

        ret = mbedtls_ecjpake_write_round_two( &ssl->handshake->ecjpake_ctx,
                p, end - p, &jlen, ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_write_round_two", ret );
            return( ret );
        }

        p += jlen;
        n += jlen;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /* Note: we don't support identity hints, until someone asks
         * for them. */
        *(p++) = 0x00;
        *(p++) = 0x00;

        n += 2;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl->conf->dhm_P.p == NULL || ssl->conf->dhm_G.p == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no DH parameters set" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * Ephemeral DH parameters:
         *
         * struct {
         *     opaque dh_p<1..2^16-1>;
         *     opaque dh_g<1..2^16-1>;
         *     opaque dh_Ys<1..2^16-1>;
         * } ServerDHParams;
         */
        if( ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.P, &ssl->conf->dhm_P ) ) != 0 ||
            ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.G, &ssl->conf->dhm_G ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_mpi_copy", ret );
            return( ret );
        }

        if( ( ret = mbedtls_dhm_make_params( &ssl->handshake->dhm_ctx,
                        (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                        p, &len, ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: P ", &ssl->handshake->dhm_ctx.P  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: G ", &ssl->handshake->dhm_ctx.G  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /*
         * Ephemeral ECDH parameters:
         *
         * struct {
         *     ECParameters curve_params;
         *     ECPoint      public;
         * } ServerECDHParams;
         */
        const mbedtls_ecp_curve_info **curve = NULL;
        const mbedtls_ecp_group_id *gid;

        /* Match our preference list against the offered curves */
        for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
            for( curve = ssl->handshake->curves; *curve != NULL; curve++ )
                if( (*curve)->grp_id == *gid )
                    goto curve_matching_done;

curve_matching_done:
        if( curve == NULL || *curve == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no matching curve for ECDHE" ) );
            return( MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDHE curve: %s", (*curve)->name ) );

        if( ( ret = mbedtls_ecp_group_load( &ssl->handshake->ecdh_ctx.grp,
                                       (*curve)->grp_id ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecp_group_load", ret );
            return( ret );
        }

        if( ( ret = mbedtls_ecdh_make_params( &ssl->handshake->ecdh_ctx, &len,
                                      p, MBEDTLS_SSL_MAX_CONTENT_LEN - n,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q ", &ssl->handshake->ecdh_ctx.Q );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t signature_len = 0;
        unsigned int hashlen = 0;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;

        /*
         * Choose hash algorithm. NONE means MD5 + SHA1 here.
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            md_alg = mbedtls_ssl_md_alg_from_hash( ssl->handshake->sig_alg );

            if( md_alg == MBEDTLS_MD_NONE )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ciphersuite_info->key_exchange ==
                  MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
        {
            md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            md_alg = MBEDTLS_MD_NONE;
        }

        /*
         * Compute the hash to be signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes,  64 );
            mbedtls_md5_update( &mbedtls_md5, dig_signed, dig_signed_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes,  64 );
            mbedtls_sha1_update( &mbedtls_sha1, dig_signed, dig_signed_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            hashlen = 36;

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;
            const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, dig_signed, dig_signed_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        /*
         * Make the signature
         */
        if( mbedtls_ssl_own_key( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            *(p++) = ssl->handshake->sig_alg;
            *(p++) = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

            n += 2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash, hashlen,
                        p + 2 , &signature_len,
                        ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( signature_len >> 8 );
        *(p++) = (unsigned char)( signature_len      );
        n += 2;

        MBEDTLS_SSL_DEBUG_BUF( 3, "my signature", p, signature_len );

        n += signature_len;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

    ssl->out_msglen  = 4 + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server key exchange" ) );

    return( 0 );
}